

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcoreapplication.cpp
# Opt level: O2

QString * __thiscall
QCoreApplicationPrivate::appName(QString *__return_storage_ptr__,QCoreApplicationPrivate *this)

{
  char *__s;
  Data *pDVar1;
  char *pcVar2;
  char *pcVar3;
  long in_FS_OFFSET;
  QByteArrayView ba;
  char *local_50;
  QByteArrayView local_48;
  QArrayDataPointer<char16_t> local_38;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  (__return_storage_ptr__->d).size = 0;
  (__return_storage_ptr__->d).d = (Data *)0x0;
  (__return_storage_ptr__->d).ptr = (char16_t *)0x0;
  __s = *this->argv;
  if (__s != (char *)0x0) {
    pcVar2 = strrchr(__s,0x2f);
    pcVar3 = pcVar2 + 1;
    if (pcVar2 == (char *)0x0) {
      pcVar3 = __s;
    }
    local_50 = pcVar3;
    QByteArrayView::QByteArrayView<char_*,_true>(&local_48,&local_50);
    ba.m_data = pcVar3;
    ba.m_size = (qsizetype)local_48.m_data;
    QString::fromLocal8Bit((QString *)&local_38,(QString *)local_48.m_size,ba);
    pDVar1 = local_38.d;
    local_38.d = (Data *)0x0;
    (__return_storage_ptr__->d).d = pDVar1;
    (__return_storage_ptr__->d).ptr = local_38.ptr;
    local_38.ptr = (char16_t *)0x0;
    (__return_storage_ptr__->d).size = local_38.size;
    local_38.size = 0;
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_38);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

QString QCoreApplicationPrivate::appName() const
{
    QString applicationName;
#ifdef Q_OS_DARWIN
    applicationName = infoDictionaryStringProperty(QStringLiteral("CFBundleName"));
#endif
    if (applicationName.isEmpty() && argv[0]) {
        char *p = strrchr(argv[0], '/');
        applicationName = QString::fromLocal8Bit(p ? p + 1 : argv[0]);
    }

    return applicationName;
}